

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_update_frame_size(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  CommonTileParams *tiles;
  uint8_t uVar1;
  byte bVar2;
  SequenceHeader *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  BLOCK_SIZE BVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  qm_val_t *(*__src) [19];
  int iVar13;
  int iVar14;
  qm_val_t *(*__dest) [19];
  bool bVar15;
  
  (*(cpi->common).mi_params.set_mb_mi)
            (&(cpi->common).mi_params,(cpi->common).width,(cpi->common).height,
             (cpi->sf).part_sf.default_min_partition_size);
  uVar1 = ((cpi->common).seq_params)->monochrome;
  __dest = (cpi->td).mb.e_mbd.plane[0].seg_iqmatrix;
  uVar11 = 0;
  do {
    if (*(char *)((long)(__dest + -2) + 0x80) == '\0') {
      uVar4 = *(undefined8 *)(cpi->common).quant_params.y_dequant_QTX;
      uVar5 = *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 2);
      uVar6 = *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar6;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar4;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar5;
      __src = (cpi->common).quant_params.y_iqmatrix;
    }
    else if (uVar11 == 1) {
      uVar4 = *(undefined8 *)(cpi->common).quant_params.u_dequant_QTX;
      uVar5 = *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 2);
      uVar6 = *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar6;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar4;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar5;
      __src = (cpi->common).quant_params.u_iqmatrix;
    }
    else {
      uVar4 = *(undefined8 *)(cpi->common).quant_params.v_dequant_QTX;
      uVar5 = *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 2);
      uVar6 = *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 6);
      *(undefined8 *)((long)(__dest + -1) + 0x78) =
           *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 4);
      *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar6;
      *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar4;
      *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar5;
      __src = (cpi->common).quant_params.v_iqmatrix;
    }
    memcpy(__dest,__src,0x4c0);
    if (uVar1 != '\0') break;
    __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
    bVar15 = uVar11 < 2;
    uVar11 = uVar11 + 1;
  } while (bVar15);
  cm = &cpi->common;
  (cpi->td).mb.e_mbd.mi_stride = (cpi->common).mi_params.mi_stride;
  (cpi->td).mb.e_mbd.error_info = (cpi->common).error;
  cfl_init(&(cpi->td).mb.e_mbd.cfl,(cpi->common).seq_params);
  if (cpi->ppi->seq_params_locked == 0) {
    pSVar3 = (cpi->common).seq_params;
    BVar7 = av1_select_sb_size(&cpi->oxcf,(cpi->common).width,(cpi->common).height,
                               cpi->ppi->number_spatial_layers);
    pSVar3->sb_size = BVar7;
    pSVar3->mib_size =
         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar7];
    pSVar3->mib_size_log2 = (uint)""[BVar7];
  }
  pSVar3 = (cpi->common).seq_params;
  tiles = &(cpi->common).tiles;
  av1_get_tile_limits(cm);
  bVar2 = (byte)pSVar3->mib_size_log2;
  iVar12 = (cpi->common).mi_params.mi_cols + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f);
  if (((cpi->oxcf).tile_cfg.tile_width_count == 0) || ((cpi->oxcf).tile_cfg.tile_height_count == 0))
  {
    (cpi->common).tiles.uniform_spacing = 1;
    iVar9 = (cpi->oxcf).tile_cfg.tile_columns;
    iVar14 = (cpi->common).tiles.max_width_sb;
    iVar8 = (cpi->common).tiles.min_log2_cols;
    if (iVar8 < iVar9) {
      iVar8 = iVar9;
    }
    (cpi->common).tiles.log2_cols = iVar8;
    iVar12 = iVar12 * (uint)(cpi->common).superres_scale_denominator;
    iVar9 = iVar12 + 4;
    iVar12 = iVar12 + 0xb;
    if (-1 < iVar9) {
      iVar12 = iVar9;
    }
    iVar9 = -1;
    do {
      iVar9 = iVar9 + 1;
    } while (iVar14 << ((byte)iVar9 & 0x1f) <= iVar12 >> 3);
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    iVar12 = (cpi->common).tiles.max_log2_cols;
    if (iVar12 <= iVar9) {
      iVar9 = iVar12;
    }
    (cpi->common).tiles.log2_cols = iVar9;
  }
  else if ((cpi->oxcf).tile_cfg.tile_widths[0] < 0) {
    auto_tile_size_balancing(cm,iVar12,(cpi->oxcf).tile_cfg.tile_columns,1);
  }
  else {
    (cpi->common).tiles.uniform_spacing = 0;
    if (iVar12 < 1) {
      uVar11 = 0;
    }
    else {
      iVar9 = (cpi->common).tiles.max_width_sb;
      iVar8 = 0;
      uVar10 = 0;
      iVar14 = 0;
      do {
        (cpi->common).tiles.col_start_sb[uVar10] = iVar8;
        iVar13 = iVar14 + 1;
        if ((cpi->oxcf).tile_cfg.tile_width_count <= iVar13) {
          iVar13 = 0;
        }
        iVar14 = (cpi->oxcf).tile_cfg.tile_widths[iVar14];
        if (iVar9 <= iVar14) {
          iVar14 = iVar9;
        }
        uVar11 = uVar10 + 1;
      } while ((uVar10 < 0x3f) &&
              (iVar8 = iVar8 + iVar14, uVar10 = uVar11, iVar14 = iVar13, iVar8 < iVar12));
    }
    (cpi->common).tiles.cols = (int)uVar11;
    (cpi->common).tiles.col_start_sb[uVar11 & 0xffffffff] = iVar12;
  }
  av1_calculate_tile_cols
            (pSVar3,(cpi->common).mi_params.mi_rows,(cpi->common).mi_params.mi_cols,tiles);
  bVar2 = (byte)pSVar3->mib_size_log2;
  iVar12 = (cpi->common).mi_params.mi_rows + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f);
  if ((cpi->common).tiles.uniform_spacing == 0) {
    if ((cpi->oxcf).tile_cfg.tile_heights[0] < 0) {
      auto_tile_size_balancing(cm,iVar12,(cpi->oxcf).tile_cfg.tile_rows,0);
    }
    else {
      if (iVar12 < 1) {
        uVar11 = 0;
      }
      else {
        iVar9 = (cpi->common).tiles.max_height_sb;
        iVar8 = 0;
        uVar10 = 0;
        iVar14 = 0;
        do {
          (cpi->common).tiles.row_start_sb[uVar10] = iVar8;
          iVar13 = iVar14 + 1;
          if ((cpi->oxcf).tile_cfg.tile_height_count <= iVar13) {
            iVar13 = 0;
          }
          iVar14 = (cpi->oxcf).tile_cfg.tile_heights[iVar14];
          if (iVar9 <= iVar14) {
            iVar14 = iVar9;
          }
          uVar11 = uVar10 + 1;
        } while ((uVar10 < 0x3f) &&
                (iVar8 = iVar8 + iVar14, uVar10 = uVar11, iVar14 = iVar13, iVar8 < iVar12));
      }
      (cpi->common).tiles.rows = (int)uVar11;
      (cpi->common).tiles.row_start_sb[uVar11 & 0xffffffff] = iVar12;
    }
  }
  else {
    iVar12 = (cpi->oxcf).tile_cfg.tile_rows;
    iVar9 = (cpi->common).tiles.min_log2_rows;
    iVar14 = (cpi->common).tiles.max_log2_rows;
    if (iVar9 < iVar12) {
      iVar9 = iVar12;
    }
    if (iVar14 <= iVar9) {
      iVar9 = iVar14;
    }
    (cpi->common).tiles.log2_rows = iVar9;
  }
  av1_calculate_tile_rows(pSVar3,(cpi->common).mi_params.mi_rows,tiles);
  return;
}

Assistant:

void av1_update_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;

  // Setup mi_params here in case we need more mi's.
  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->set_mb_mi(mi_params, cm->width, cm->height,
                       cpi->sf.part_sf.default_min_partition_size);

  av1_init_macroblockd(cm, xd);

  if (!cpi->ppi->seq_params_locked)
    set_sb_size(cm->seq_params,
                av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                   cpi->ppi->number_spatial_layers));

  set_tile_info(cm, &cpi->oxcf.tile_cfg);
}